

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

secp256k1_context * secp256k1_context_preallocated_clone(secp256k1_context *ctx,void *prealloc)

{
  size_t __n;
  secp256k1_context *ret;
  size_t prealloc_size;
  void *prealloc_local;
  secp256k1_context *ctx_local;
  
  if (prealloc == (void *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"prealloc != NULL");
    ctx_local = (secp256k1_context *)0x0;
  }
  else {
    __n = secp256k1_context_preallocated_clone_size(ctx);
    memcpy(prealloc,ctx,__n);
    secp256k1_ecmult_gen_context_finalize_memcpy
              ((secp256k1_ecmult_gen_context *)((long)prealloc + 8),&ctx->ecmult_gen_ctx);
    secp256k1_ecmult_context_finalize_memcpy((secp256k1_ecmult_context *)prealloc,&ctx->ecmult_ctx);
    ctx_local = (secp256k1_context *)prealloc;
  }
  return ctx_local;
}

Assistant:

secp256k1_context* secp256k1_context_preallocated_clone(const secp256k1_context* ctx, void* prealloc) {
    size_t prealloc_size;
    secp256k1_context* ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(prealloc != NULL);

    prealloc_size = secp256k1_context_preallocated_clone_size(ctx);
    ret = (secp256k1_context*)prealloc;
    memcpy(ret, ctx, prealloc_size);
    secp256k1_ecmult_gen_context_finalize_memcpy(&ret->ecmult_gen_ctx, &ctx->ecmult_gen_ctx);
    secp256k1_ecmult_context_finalize_memcpy(&ret->ecmult_ctx, &ctx->ecmult_ctx);
    return ret;
}